

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void av1_get_horver_correlation_full_c
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  int16_t *piVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int16_t *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  short *psVar13;
  long lVar14;
  long lVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ulong local_70;
  
  iVar3 = (int)*diff;
  lVar7 = (long)iVar3;
  local_70 = (ulong)(uint)(iVar3 * iVar3);
  lVar15 = (long)width;
  lVar4 = 0;
  uVar5 = local_70;
  lVar14 = lVar7;
  uVar17 = local_70;
  lVar18 = lVar7;
  for (lVar6 = 1; lVar6 < lVar15; lVar6 = lVar6 + 1) {
    iVar3 = (int)diff[lVar6];
    lVar9 = (long)iVar3;
    lVar18 = lVar18 + lVar9;
    lVar14 = lVar14 + lVar9;
    uVar17 = uVar17 + (uint)(iVar3 * iVar3);
    uVar5 = uVar5 + (uint)(iVar3 * iVar3);
    lVar4 = lVar4 + diff[lVar6 + -1] * lVar9;
  }
  lVar9 = 0;
  piVar8 = diff;
  for (lVar6 = 1; lVar6 < height; lVar6 = lVar6 + 1) {
    iVar3 = (int)piVar8[stride];
    sVar2 = *piVar8;
    piVar8 = piVar8 + stride;
    lVar11 = (long)iVar3;
    lVar18 = lVar18 + lVar11;
    lVar7 = lVar7 + lVar11;
    uVar17 = uVar17 + (uint)(iVar3 * iVar3);
    local_70 = local_70 + (uint)(iVar3 * iVar3);
    lVar9 = lVar9 + sVar2 * lVar11;
  }
  piVar8 = diff;
  for (lVar6 = 1; lVar6 < height; lVar6 = lVar6 + 1) {
    piVar1 = piVar8 + stride;
    for (lVar11 = 1; lVar11 < lVar15; lVar11 = lVar11 + 1) {
      iVar3 = (int)piVar1[lVar11];
      lVar10 = (long)iVar3;
      lVar18 = lVar18 + lVar10;
      uVar17 = uVar17 + (uint)(iVar3 * iVar3);
      lVar4 = lVar4 + piVar1[lVar11 + -1] * lVar10;
      lVar9 = lVar9 + piVar8[lVar11] * lVar10;
    }
    piVar8 = piVar1;
  }
  uVar12 = 0;
  uVar16 = 0;
  if (0 < width) {
    uVar16 = (ulong)(uint)width;
  }
  lVar11 = 0;
  lVar6 = 0;
  for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
    iVar3 = (int)diff[(long)(stride * (height + -1)) + uVar12];
    lVar6 = lVar6 + iVar3;
    lVar11 = lVar11 + (ulong)(uint)(iVar3 * iVar3);
  }
  lVar10 = 0;
  uVar16 = 0;
  if (0 < height) {
    uVar16 = (ulong)(uint)height;
  }
  psVar13 = diff + lVar15 + -1;
  lVar15 = 0;
  while (bVar19 = uVar16 != 0, uVar16 = uVar16 - 1, bVar19) {
    iVar3 = (int)*psVar13;
    lVar15 = lVar15 + iVar3;
    lVar10 = lVar10 + (ulong)(uint)(iVar3 * iVar3);
    psVar13 = psVar13 + stride;
  }
  lVar15 = lVar18 - lVar15;
  lVar6 = lVar18 - lVar6;
  fVar21 = (float)((width + -1) * height);
  fVar24 = (float)((height + -1) * width);
  fVar22 = (float)(long)(uVar17 - lVar10) - (float)(lVar15 * lVar15) / fVar21;
  fVar25 = (float)(long)(uVar17 - lVar11) - (float)(lVar6 * lVar6) / fVar24;
  fVar23 = 1.0;
  if (0.0 < fVar22) {
    lVar7 = lVar18 - lVar7;
    fVar20 = (float)(long)(uVar17 - local_70) - (float)(lVar7 * lVar7) / fVar21;
    fVar23 = 1.0;
    if (0.0 < fVar20) {
      fVar20 = fVar20 * fVar22;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar20 = ((float)lVar4 - (float)(lVar15 * lVar7) / fVar21) / fVar20;
      fVar23 = 0.0;
      if (0.0 <= fVar20) {
        fVar23 = fVar20;
      }
    }
  }
  *hcorr = fVar23;
  fVar23 = 1.0;
  if (0.0 < fVar25) {
    lVar18 = lVar18 - lVar14;
    fVar21 = (float)(long)(uVar17 - uVar5) - (float)(lVar18 * lVar18) / fVar24;
    if (0.0 < fVar21) {
      fVar21 = fVar21 * fVar25;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar21 = ((float)lVar9 - (float)(lVar6 * lVar18) / fVar24) / fVar21;
      fVar23 = 0.0;
      if (0.0 <= fVar21) {
        fVar23 = fVar21;
      }
    }
  }
  *vcorr = fVar23;
  return;
}

Assistant:

void av1_get_horver_correlation_full_c(const int16_t *diff, int stride,
                                       int width, int height, float *hcorr,
                                       float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - left neighbor pixel
  // z - top neighbor pixel
  int64_t x_sum = 0, x2_sum = 0, xy_sum = 0, xz_sum = 0;
  int64_t x_firstrow = 0, x_finalrow = 0, x_firstcol = 0, x_finalcol = 0;
  int64_t x2_firstrow = 0, x2_finalrow = 0, x2_firstcol = 0, x2_finalcol = 0;

  // First, process horizontal correlation on just the first row
  x_sum += diff[0];
  x2_sum += diff[0] * diff[0];
  x_firstrow += diff[0];
  x2_firstrow += diff[0] * diff[0];
  for (int j = 1; j < width; ++j) {
    const int16_t x = diff[j];
    const int16_t y = diff[j - 1];
    x_sum += x;
    x_firstrow += x;
    x2_sum += x * x;
    x2_firstrow += x * x;
    xy_sum += x * y;
  }

  // Process vertical correlation in the first column
  x_firstcol += diff[0];
  x2_firstcol += diff[0] * diff[0];
  for (int i = 1; i < height; ++i) {
    const int16_t x = diff[i * stride];
    const int16_t z = diff[(i - 1) * stride];
    x_sum += x;
    x_firstcol += x;
    x2_sum += x * x;
    x2_firstcol += x * x;
    xz_sum += x * z;
  }

  // Now process horiz and vert correlation through the rest unit
  for (int i = 1; i < height; ++i) {
    for (int j = 1; j < width; ++j) {
      const int16_t x = diff[i * stride + j];
      const int16_t y = diff[i * stride + j - 1];
      const int16_t z = diff[(i - 1) * stride + j];
      x_sum += x;
      x2_sum += x * x;
      xy_sum += x * y;
      xz_sum += x * z;
    }
  }

  for (int j = 0; j < width; ++j) {
    x_finalrow += diff[(height - 1) * stride + j];
    x2_finalrow +=
        diff[(height - 1) * stride + j] * diff[(height - 1) * stride + j];
  }
  for (int i = 0; i < height; ++i) {
    x_finalcol += diff[i * stride + width - 1];
    x2_finalcol += diff[i * stride + width - 1] * diff[i * stride + width - 1];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}